

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O3

void Dch_ClassesCollectOneClass(Dch_Cla_t *p,Aig_Obj_t *pRepr,Vec_Ptr_t *vRoots)

{
  size_t __size;
  Aig_Obj_t *pAVar1;
  void **ppvVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  vRoots->nSize = 0;
  piVar3 = p->pClassSizes;
  iVar4 = pRepr->Id;
  lVar5 = (long)iVar4;
  if (0 < piVar3[lVar5]) {
    iVar7 = 0;
    lVar6 = 0;
    do {
      pAVar1 = p->pId2Class[lVar5][lVar6];
      if (pAVar1 != (Aig_Obj_t *)0x0) {
        if (iVar7 == vRoots->nCap) {
          if (iVar7 < 0x10) {
            if (vRoots->pArray == (void **)0x0) {
              ppvVar2 = (void **)malloc(0x80);
            }
            else {
              ppvVar2 = (void **)realloc(vRoots->pArray,0x80);
            }
            vRoots->pArray = ppvVar2;
            vRoots->nCap = 0x10;
          }
          else {
            __size = (ulong)(uint)(iVar7 * 2) * 8;
            if (vRoots->pArray == (void **)0x0) {
              ppvVar2 = (void **)malloc(__size);
            }
            else {
              ppvVar2 = (void **)realloc(vRoots->pArray,__size);
            }
            vRoots->pArray = ppvVar2;
            vRoots->nCap = iVar7 * 2;
          }
        }
        else {
          ppvVar2 = vRoots->pArray;
        }
        iVar4 = vRoots->nSize;
        iVar7 = iVar4 + 1;
        vRoots->nSize = iVar7;
        ppvVar2[iVar4] = pAVar1;
        piVar3 = p->pClassSizes;
        iVar4 = pRepr->Id;
      }
      lVar6 = lVar6 + 1;
      lVar5 = (long)iVar4;
    } while (lVar6 < piVar3[lVar5]);
    if (1 < iVar7) {
      return;
    }
  }
  __assert_fail("Vec_PtrSize(vRoots) > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                ,0x214,"void Dch_ClassesCollectOneClass(Dch_Cla_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Dch_ClassesCollectOneClass( Dch_Cla_t * p, Aig_Obj_t * pRepr, Vec_Ptr_t * vRoots )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrClear( vRoots );
    Dch_ClassForEachNode( p, pRepr, pObj, i )
        Vec_PtrPush( vRoots, pObj );
    assert( Vec_PtrSize(vRoots) > 1 ); 
}